

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O1

void __thiscall
pybind11::array::array
          (array *this,dtype *dt,ShapeContainer *shape,StridesContainer *strides,void *ptr,
          handle base)

{
  pointer plVar1;
  pointer plVar2;
  _func_int_PyObject_ptr_PyObject_ptr *p_Var3;
  object oVar4;
  dtype dVar5;
  bool bVar6;
  npy_api *pnVar7;
  error_already_set *this_00;
  size_type __n;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  object tmp;
  dtype descr;
  pointer local_50;
  object local_38;
  
  (this->super_buffer).super_object.super_handle.m_ptr = (PyObject *)0x0;
  if ((strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    tmp.super_handle.m_ptr = (handle)(long)(int)(dt->super_object).super_handle.m_ptr[2].ob_refcnt;
    plVar1 = (shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar2 = (shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar10 = (long)plVar2 - (long)plVar1;
    __n = lVar10 >> 3;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&descr,__n,(value_type_conflict1 *)&tmp,
               (allocator_type *)&local_38);
    if ((plVar2 != plVar1) && (__n != 1)) {
      plVar1 = (shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = *(long *)((long)descr.super_object.super_handle.m_ptr + -8 + lVar10);
      do {
        lVar10 = lVar10 * plVar1[__n - 1];
        *(long *)((long)descr.super_object.super_handle.m_ptr + -0x10 + __n * 8) = lVar10;
        __n = __n - 1;
      } while (__n != 1);
    }
    std::vector<long,_std::allocator<long>_>::_M_move_assign(&strides->v,&descr);
    if ((handle)descr.super_object.super_handle.m_ptr != (handle)0x0) {
      operator_delete((void *)descr.super_object.super_handle.m_ptr,
                      (long)local_50 - (long)descr.super_object.super_handle.m_ptr);
    }
  }
  uVar8 = (long)(shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 != (long)(strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start) {
    pybind11_fail("NumPy: shape ndim doesn\'t match strides ndim");
  }
  descr.super_object.super_handle.m_ptr = (object)(dt->super_object).super_handle.m_ptr;
  if (descr.super_object.super_handle.m_ptr != (handle)0x0) {
    *(long *)descr.super_object.super_handle.m_ptr =
         *(long *)descr.super_object.super_handle.m_ptr + 1;
  }
  uVar9 = 0;
  if (ptr != (void *)0x0 && base.m_ptr != (PyObject *)0x0) {
    bVar6 = check_(base);
    uVar9 = 0x400;
    if (bVar6) {
      (base.m_ptr)->ob_refcnt = (base.m_ptr)->ob_refcnt + 1;
      uVar9 = (uint)base.m_ptr[4].ob_refcnt & 0xfffffffb;
      tmp.super_handle.m_ptr = (handle)(handle)base.m_ptr;
      object::~object(&tmp);
    }
  }
  pnVar7 = detail::npy_api::get();
  dVar5 = descr;
  descr.super_object.super_handle.m_ptr = (object)(handle)0x0;
  tmp.super_handle.m_ptr =
       (handle)(*pnVar7->PyArray_NewFromDescr_)
                         (pnVar7->PyArray_Type_,(PyObject *)dVar5.super_object.super_handle.m_ptr,
                          (int)(uVar8 >> 3),
                          (shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,ptr,uVar9,(PyObject *)0x0);
  if (tmp.super_handle.m_ptr == (PyObject *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  if (ptr != (void *)0x0) {
    if (base.m_ptr == (PyObject *)0x0) {
      local_38.super_handle.m_ptr =
           (handle)(*pnVar7->PyArray_NewCopy_)((PyObject *)tmp.super_handle.m_ptr,-1);
      object::operator=(&tmp,&local_38);
      object::~object(&local_38);
    }
    else {
      p_Var3 = pnVar7->PyArray_SetBaseObject_;
      (base.m_ptr)->ob_refcnt = (base.m_ptr)->ob_refcnt + 1;
      (*p_Var3)((PyObject *)tmp.super_handle.m_ptr,base.m_ptr);
    }
  }
  oVar4.super_handle.m_ptr = tmp.super_handle.m_ptr;
  tmp.super_handle.m_ptr = (handle)(PyObject *)0x0;
  (this->super_buffer).super_object.super_handle.m_ptr = (PyObject *)oVar4.super_handle.m_ptr;
  object::~object(&tmp);
  object::~object(&descr.super_object);
  return;
}

Assistant:

array(const pybind11::dtype &dt,
          ShapeContainer shape,
          StridesContainer strides,
          const void *ptr = nullptr,
          handle base = handle()) {

        if (strides->empty()) {
            *strides = detail::c_strides(*shape, dt.itemsize());
        }

        auto ndim = shape->size();
        if (ndim != strides->size()) {
            pybind11_fail("NumPy: shape ndim doesn't match strides ndim");
        }
        auto descr = dt;

        int flags = 0;
        if (base && ptr) {
            if (isinstance<array>(base)) {
                /* Copy flags from base (except ownership bit) */
                flags = reinterpret_borrow<array>(base).flags()
                        & ~detail::npy_api::NPY_ARRAY_OWNDATA_;
            } else {
                /* Writable by default, easy to downgrade later on if needed */
                flags = detail::npy_api::NPY_ARRAY_WRITEABLE_;
            }
        }

        auto &api = detail::npy_api::get();
        auto tmp = reinterpret_steal<object>(api.PyArray_NewFromDescr_(
            api.PyArray_Type_,
            descr.release().ptr(),
            (int) ndim,
            // Use reinterpret_cast for PyPy on Windows (remove if fixed, checked on 7.3.1)
            reinterpret_cast<Py_intptr_t *>(shape->data()),
            reinterpret_cast<Py_intptr_t *>(strides->data()),
            const_cast<void *>(ptr),
            flags,
            nullptr));
        if (!tmp) {
            throw error_already_set();
        }
        if (ptr) {
            if (base) {
                api.PyArray_SetBaseObject_(tmp.ptr(), base.inc_ref().ptr());
            } else {
                tmp = reinterpret_steal<object>(
                    api.PyArray_NewCopy_(tmp.ptr(), -1 /* any order */));
            }
        }
        m_ptr = tmp.release().ptr();
    }